

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O0

w3Limits __thiscall w3Module::read_limits(w3Module *this,uint8_t **cursor)

{
  byte bVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  w3Limits wVar3;
  undefined1 local_70;
  allocator<char> local_51;
  string local_50;
  uint local_2c;
  uint8_t **ppuStack_28;
  uint32_t tag;
  uint8_t **cursor_local;
  w3Module *this_local;
  uint32_t uStack_10;
  w3Limits limits;
  
  ppuStack_28 = cursor;
  cursor_local = (uint8_t **)this;
  w3Limits::w3Limits((w3Limits *)((long)&this_local + 4));
  bVar1 = read_byte(this,ppuStack_28);
  local_2c = (uint)bVar1;
  if (1 < local_2c) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"invalid limit tag",&local_51);
    ThrowString(&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  limits.min = CONCAT31(limits.min._1_3_,local_2c == 1);
  this_local._4_4_ = read_varuint32(this,ppuStack_28);
  uVar2 = extraout_RDX;
  if ((limits.min & 1) != 0) {
    uStack_10 = read_varuint32(this,ppuStack_28);
    uVar2 = extraout_RDX_00;
  }
  wVar3.max = uStack_10;
  wVar3.min = this_local._4_4_;
  local_70 = (undefined1)limits.min;
  wVar3._8_4_ = (undefined4)CONCAT71((int7)((ulong)uVar2 >> 8),local_70);
  return wVar3;
}

Assistant:

w3Limits w3Module::read_limits (uint8_t** cursor)
{
    w3Limits limits;
    const uint32_t tag = read_byte (cursor);
    switch (tag)
    {
    case 0:
    case 1:
        break;
    default:
        ThrowString ("invalid limit tag");
        break;
    }
    limits.hasMax = (tag == 1);
    limits.min = read_varuint32 (cursor);
    if (limits.hasMax)
        limits.max = read_varuint32 (cursor);
    return limits;
}